

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.cpp
# Opt level: O0

void __thiscall
DescriptorKeyInfo_Constructor_SchnorrPubkey_Test::TestBody
          (DescriptorKeyInfo_Constructor_SchnorrPubkey_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  char *in_R9;
  AssertHelper local_9d0;
  Message local_9c8;
  string local_9c0;
  SchnorrPubkey local_9a0;
  string local_988;
  undefined1 local_968 [8];
  AssertionResult gtest_ar_4;
  Message local_950;
  string local_948;
  SchnorrPubkey local_928;
  string local_910;
  undefined1 local_8f0 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_8c0;
  Message local_8b8;
  bool local_8a9;
  undefined1 local_8a8 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_878;
  Message local_870;
  bool local_861;
  undefined1 local_860 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_830;
  Message local_828;
  bool local_819;
  undefined1 local_818 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_7e8;
  Message local_7e0;
  bool local_7d1;
  undefined1 local_7d0 [8];
  AssertionResult gtest_ar_;
  Message local_7b8;
  string local_7b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_790;
  undefined1 local_770 [8];
  AssertionResult gtest_ar_2;
  Message local_758;
  string local_750;
  AssertHelper local_730;
  Message local_728;
  string local_720;
  DescriptorKeyInfo local_700;
  AssertHelper local_528;
  Message local_520;
  DescriptorKeyType local_518;
  DescriptorKeyType local_514;
  undefined1 local_510 [8];
  AssertionResult gtest_ar_1;
  Message local_4f8;
  string local_4f0;
  undefined1 local_4d0 [8];
  AssertionResult gtest_ar;
  Message local_4b8;
  string local_4b0;
  AssertHelper local_490;
  Message local_488;
  allocator local_479;
  string local_478;
  DescriptorKeyInfo local_458;
  string local_280 [8];
  string key_str;
  DescriptorKeyInfo key_info;
  undefined1 local_80 [8];
  string parent_info;
  allocator local_49;
  string local_48;
  undefined1 local_28 [8];
  SchnorrPubkey pubkey;
  DescriptorKeyInfo_Constructor_SchnorrPubkey_Test *this_local;
  
  pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_48,"d3f817091de0bbe51e19b53303b12e463f664894d49cb5bf5bb19c88fbc54d8d",
             &local_49);
  cfd::core::SchnorrPubkey::SchnorrPubkey((SchnorrPubkey *)local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_80,"[ef57314e/0\'/0\'/4\']",
             (allocator *)(key_info.key_string_.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator
            ((allocator<char> *)(key_info.key_string_.field_2._M_local_buf + 0xf));
  cfd::core::DescriptorKeyInfo::DescriptorKeyInfo((DescriptorKeyInfo *)((long)&key_str.field_2 + 8))
  ;
  std::__cxx11::string::string(local_280);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_478,"",&local_479);
      cfd::core::DescriptorKeyInfo::DescriptorKeyInfo
                (&local_458,(SchnorrPubkey *)local_28,&local_478);
      cfd::core::DescriptorKeyInfo::operator=
                ((DescriptorKeyInfo *)((long)&key_str.field_2 + 8),&local_458);
      cfd::core::DescriptorKeyInfo::~DescriptorKeyInfo(&local_458);
      std::__cxx11::string::~string((string *)&local_478);
      std::allocator<char>::~allocator((allocator<char> *)&local_479);
    }
  }
  else {
    testing::Message::Message(&local_488);
    testing::internal::AssertHelper::AssertHelper
              (&local_490,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x6c7,
               "Expected: key_info = DescriptorKeyInfo(pubkey) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_490,&local_488);
    testing::internal::AssertHelper::~AssertHelper(&local_490);
    testing::Message::~Message(&local_488);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::DescriptorKeyInfo::ToString_abi_cxx11_
                (&local_4b0,(DescriptorKeyInfo *)((long)&key_str.field_2 + 8));
      std::__cxx11::string::operator=(local_280,(string *)&local_4b0);
      std::__cxx11::string::~string((string *)&local_4b0);
    }
  }
  else {
    testing::Message::Message(&local_4b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x6c8,
               "Expected: key_str = key_info.ToString() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,&local_4b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(&local_4b8);
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_4f0,(SchnorrPubkey *)local_28);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_4d0,"key_str.c_str()","pubkey.GetHex().c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_4f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4d0);
  if (!bVar1) {
    testing::Message::Message(&local_4f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x6c9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_4f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_4f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4d0);
  local_514 = cfd::core::DescriptorKeyInfo::GetKeyType
                        ((DescriptorKeyInfo *)((long)&key_str.field_2 + 8));
  local_518 = kDescriptorKeySchnorr;
  testing::internal::EqHelper<false>::
  Compare<cfd::core::DescriptorKeyType,cfd::core::DescriptorKeyType>
            ((EqHelper<false> *)local_510,"key_info.GetKeyType()",
             "DescriptorKeyType::kDescriptorKeySchnorr",&local_514,&local_518);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_510);
  if (!bVar1) {
    testing::Message::Message(&local_520);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_510);
    testing::internal::AssertHelper::AssertHelper
              (&local_528,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x6ca,pcVar2);
    testing::internal::AssertHelper::operator=(&local_528,&local_520);
    testing::internal::AssertHelper::~AssertHelper(&local_528);
    testing::Message::~Message(&local_520);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_510);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_720,(string *)local_80);
      cfd::core::DescriptorKeyInfo::DescriptorKeyInfo
                (&local_700,(SchnorrPubkey *)local_28,&local_720);
      cfd::core::DescriptorKeyInfo::operator=
                ((DescriptorKeyInfo *)((long)&key_str.field_2 + 8),&local_700);
      cfd::core::DescriptorKeyInfo::~DescriptorKeyInfo(&local_700);
      std::__cxx11::string::~string((string *)&local_720);
    }
  }
  else {
    testing::Message::Message(&local_728);
    testing::internal::AssertHelper::AssertHelper
              (&local_730,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x6cc,
               "Expected: key_info = DescriptorKeyInfo(pubkey, parent_info) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_730,&local_728);
    testing::internal::AssertHelper::~AssertHelper(&local_730);
    testing::Message::~Message(&local_728);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::DescriptorKeyInfo::ToString_abi_cxx11_
                (&local_750,(DescriptorKeyInfo *)((long)&key_str.field_2 + 8));
      std::__cxx11::string::operator=(local_280,(string *)&local_750);
      std::__cxx11::string::~string((string *)&local_750);
    }
  }
  else {
    testing::Message::Message(&local_758);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x6cd,
               "Expected: key_str = key_info.ToString() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_758);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_758);
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_7b0,(SchnorrPubkey *)local_28);
  std::operator+(&local_790,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                 &local_7b0);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_770,"key_str.c_str()","(parent_info + pubkey.GetHex()).c_str()",
             pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_790);
  std::__cxx11::string::~string((string *)&local_7b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_770);
  if (!bVar1) {
    testing::Message::Message(&local_7b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_770);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x6ce,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_7b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_7b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_770);
  bVar1 = cfd::core::DescriptorKeyInfo::HasPrivkey
                    ((DescriptorKeyInfo *)((long)&key_str.field_2 + 8));
  local_7d1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_7d0,&local_7d1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7d0);
  if (!bVar1) {
    testing::Message::Message(&local_7e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_7d0,
               (AssertionResult *)"key_info.HasPrivkey()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_7e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x6cf,pcVar2);
    testing::internal::AssertHelper::operator=(&local_7e8,&local_7e0);
    testing::internal::AssertHelper::~AssertHelper(&local_7e8);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_7e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7d0);
  local_819 = cfd::core::DescriptorKeyInfo::HasSchnorrPubkey
                        ((DescriptorKeyInfo *)((long)&key_str.field_2 + 8));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_818,&local_819,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_818);
  if (!bVar1) {
    testing::Message::Message(&local_828);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_818,
               (AssertionResult *)"key_info.HasSchnorrPubkey()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_830,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x6d0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_830,&local_828);
    testing::internal::AssertHelper::~AssertHelper(&local_830);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_828);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_818);
  bVar1 = cfd::core::DescriptorKeyInfo::HasExtPubkey
                    ((DescriptorKeyInfo *)((long)&key_str.field_2 + 8));
  local_861 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_860,&local_861,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_860);
  if (!bVar1) {
    testing::Message::Message(&local_870);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_860,
               (AssertionResult *)"key_info.HasExtPubkey()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_878,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x6d1,pcVar2);
    testing::internal::AssertHelper::operator=(&local_878,&local_870);
    testing::internal::AssertHelper::~AssertHelper(&local_878);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_870);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_860);
  bVar1 = cfd::core::DescriptorKeyInfo::HasExtPrivkey
                    ((DescriptorKeyInfo *)((long)&key_str.field_2 + 8));
  local_8a9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_8a8,&local_8a9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8a8);
  if (!bVar1) {
    testing::Message::Message(&local_8b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_3.message_,(internal *)local_8a8,
               (AssertionResult *)"key_info.HasExtPrivkey()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_8c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x6d2,pcVar2);
    testing::internal::AssertHelper::operator=(&local_8c0,&local_8b8);
    testing::internal::AssertHelper::~AssertHelper(&local_8c0);
    std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_8b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8a8);
  cfd::core::DescriptorKeyInfo::GetSchnorrPubkey
            (&local_928,(DescriptorKeyInfo *)((long)&key_str.field_2 + 8));
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_910,&local_928);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_948,(SchnorrPubkey *)local_28);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_8f0,"key_info.GetSchnorrPubkey().GetHex()","pubkey.GetHex()",
             &local_910,&local_948);
  std::__cxx11::string::~string((string *)&local_948);
  std::__cxx11::string::~string((string *)&local_910);
  cfd::core::SchnorrPubkey::~SchnorrPubkey(&local_928);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8f0);
  if (!bVar1) {
    testing::Message::Message(&local_950);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_8f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x6d3,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_950);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_950);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8f0);
  cfd::core::DescriptorKeyInfo::GetSchnorrPubkey
            (&local_9a0,(DescriptorKeyInfo *)((long)&key_str.field_2 + 8));
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_988,&local_9a0);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_9c0,(SchnorrPubkey *)local_28);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_968,"key_info.GetSchnorrPubkey().GetHex()","pubkey.GetHex()",
             &local_988,&local_9c0);
  std::__cxx11::string::~string((string *)&local_9c0);
  std::__cxx11::string::~string((string *)&local_988);
  cfd::core::SchnorrPubkey::~SchnorrPubkey(&local_9a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_968);
  if (!bVar1) {
    testing::Message::Message(&local_9c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_968);
    testing::internal::AssertHelper::AssertHelper
              (&local_9d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x6d4,pcVar2);
    testing::internal::AssertHelper::operator=(&local_9d0,&local_9c8);
    testing::internal::AssertHelper::~AssertHelper(&local_9d0);
    testing::Message::~Message(&local_9c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_968);
  std::__cxx11::string::~string(local_280);
  cfd::core::DescriptorKeyInfo::~DescriptorKeyInfo
            ((DescriptorKeyInfo *)((long)&key_str.field_2 + 8));
  std::__cxx11::string::~string((string *)local_80);
  cfd::core::SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)local_28);
  return;
}

Assistant:

TEST(DescriptorKeyInfo, Constructor_SchnorrPubkey) {
  SchnorrPubkey pubkey("d3f817091de0bbe51e19b53303b12e463f664894d49cb5bf5bb19c88fbc54d8d");
  std::string parent_info = "[ef57314e/0'/0'/4']";
  DescriptorKeyInfo key_info;
  std::string key_str;

  EXPECT_NO_THROW(key_info = DescriptorKeyInfo(pubkey));
  EXPECT_NO_THROW(key_str = key_info.ToString());
  EXPECT_STREQ(key_str.c_str(), pubkey.GetHex().c_str());
  EXPECT_EQ(key_info.GetKeyType(), DescriptorKeyType::kDescriptorKeySchnorr);

  EXPECT_NO_THROW(key_info = DescriptorKeyInfo(pubkey, parent_info));
  EXPECT_NO_THROW(key_str = key_info.ToString());
  EXPECT_STREQ(key_str.c_str(), (parent_info + pubkey.GetHex()).c_str());
  EXPECT_FALSE(key_info.HasPrivkey());
  EXPECT_TRUE(key_info.HasSchnorrPubkey());
  EXPECT_FALSE(key_info.HasExtPubkey());
  EXPECT_FALSE(key_info.HasExtPrivkey());
  EXPECT_EQ(key_info.GetSchnorrPubkey().GetHex(), pubkey.GetHex());
  EXPECT_EQ(key_info.GetSchnorrPubkey().GetHex(), pubkey.GetHex());
}